

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::SubqueryExpression::Deserialize(SubqueryExpression *this,Deserializer *deserializer)

{
  SubqueryExpression *this_00;
  pointer pSVar1;
  _Head_base<0UL,_duckdb::SubqueryExpression_*,_false> local_20;
  
  this_00 = (SubqueryExpression *)operator_new(0x58);
  SubqueryExpression(this_00);
  local_20._M_head_impl = this_00;
  pSVar1 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::SubqueryType>
            (deserializer,200,"subquery_type",&pSVar1->subquery_type);
  pSVar1 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
            (deserializer,0xc9,"subquery",&pSVar1->subquery);
  pSVar1 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0xca,"child",&pSVar1->child);
  pSVar1 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::ExpressionType>
            (deserializer,0xcb,"comparison_type",&pSVar1->comparison_type);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> SubqueryExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SubqueryExpression>(new SubqueryExpression());
	deserializer.ReadProperty<SubqueryType>(200, "subquery_type", result->subquery_type);
	deserializer.ReadPropertyWithDefault<unique_ptr<SelectStatement>>(201, "subquery", result->subquery);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(202, "child", result->child);
	deserializer.ReadProperty<ExpressionType>(203, "comparison_type", result->comparison_type);
	return std::move(result);
}